

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_function_binary.h
# Opt level: O0

vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
* __thiscall
lf::mesh::utils::internal::OperatorMultiplication::operator()
          (vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
           *__return_storage_ptr__,OperatorMultiplication *this,
          vector<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_std::allocator<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>_>
          *u,vector<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
             *v,int param_3)

{
  ulong uVar1;
  size_type sVar2;
  PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_> *this_00;
  Index IVar3;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *this_01;
  Index IVar4;
  MatrixBase<Eigen::Matrix<double,2,2,0,2,2>> *this_02;
  MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *other;
  Matrix<double,2,1,0,2,1> *this_03;
  Product<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> PVar5;
  Product<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> local_2e8
  ;
  allocator<char> local_2d1;
  string local_2d0;
  allocator<char> local_2a9;
  string local_2a8;
  allocator<char> local_281;
  string local_280;
  string local_260;
  allocator<char> local_239;
  string local_238;
  allocator<char> local_211;
  string local_210;
  stringstream local_1f0 [8];
  stringstream ss;
  ostream local_1e0 [376];
  ulong local_68;
  size_t i;
  allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> local_49;
  undefined1 local_48 [8];
  vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
  result;
  int param_3_local;
  vector<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  *v_local;
  vector<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_std::allocator<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>_>
  *u_local;
  OperatorMultiplication *this_local;
  
  result.
  super__Vector_base<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = param_3;
  sVar2 = std::
          vector<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_std::allocator<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>_>
          ::size(u);
  std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>::allocator(&local_49);
  std::
  vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
  ::vector((vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
            *)local_48,sVar2,&local_49);
  std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>::~allocator(&local_49);
  local_68 = 0;
  while( true ) {
    uVar1 = local_68;
    sVar2 = std::
            vector<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_std::allocator<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>_>
            ::size(u);
    if (sVar2 <= uVar1) {
      std::
      vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
      ::vector(__return_storage_ptr__,
               (vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
                *)local_48);
      std::
      vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
      ::~vector((vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
                 *)local_48);
      return __return_storage_ptr__;
    }
    this_00 = &std::
               vector<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_std::allocator<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>_>
               ::operator[](u,local_68)->
               super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>;
    IVar3 = Eigen::PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>::cols(this_00);
    this_01 = &std::
               vector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
               ::operator[](v,local_68)->
               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>;
    IVar4 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::rows(this_01);
    if (IVar3 != IVar4) break;
    this_02 = (MatrixBase<Eigen::Matrix<double,2,2,0,2,2>> *)
              std::
              vector<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_std::allocator<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>_>
              ::operator[](u,local_68);
    other = (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
            std::
            vector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
            ::operator[](v,local_68);
    PVar5 = Eigen::MatrixBase<Eigen::Matrix<double,2,2,0,2,2>>::operator*(this_02,other);
    local_2e8 = PVar5;
    this_03 = (Matrix<double,2,1,0,2,1> *)
              std::
              vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
              ::operator[]((vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
                            *)local_48,local_68);
    Eigen::Matrix<double,2,1,0,2,1>::operator=
              (this_03,(DenseBase<Eigen::Product<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>
                        *)&local_2e8);
    local_68 = local_68 + 1;
  }
  std::__cxx11::stringstream::stringstream(local_1f0);
  std::operator<<(local_1e0,"#cols of lhs doesn\'t match #rows of rhs");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_210,"u[i].cols() == v[i].rows()",&local_211);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_238,
             "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/utils/mesh_function_binary.h"
             ,&local_239);
  std::__cxx11::stringstream::str();
  lf::base::AssertionFailed(&local_210,&local_238,0x1df,&local_260);
  std::__cxx11::string::~string((string *)&local_260);
  std::__cxx11::string::~string((string *)&local_238);
  std::allocator<char>::~allocator(&local_239);
  std::__cxx11::string::~string((string *)&local_210);
  std::allocator<char>::~allocator(&local_211);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_280,"false",&local_281);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2a8,
             "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/utils/mesh_function_binary.h"
             ,&local_2a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2d0,"",&local_2d1);
  lf::base::AssertionFailed(&local_280,&local_2a8,0x1df,&local_2d0);
  std::__cxx11::string::~string((string *)&local_2d0);
  std::allocator<char>::~allocator(&local_2d1);
  std::__cxx11::string::~string((string *)&local_2a8);
  std::allocator<char>::~allocator(&local_2a9);
  std::__cxx11::string::~string((string *)&local_280);
  std::allocator<char>::~allocator(&local_281);
  abort();
}

Assistant:

auto operator()(const std::vector<Eigen::Matrix<S1, R1, C1, O1, MR1, MC1>>& u,
                  const std::vector<Eigen::Matrix<S2, R2, C2, O2, MR2, MC2>>& v,
                  int /*unused*/) const {
    using scalar_t = decltype(S1(0) * S2(0));                      // NOLINT
    if constexpr (R1 != Eigen::Dynamic && C2 != Eigen::Dynamic) {  // NOLINT
      // The result is fixed size
      static_assert(C1 == Eigen::Dynamic || R2 == Eigen::Dynamic || C1 == R2,
                    "#cols of lhs doesn't match #rows of rhs");

      std::vector<Eigen::Matrix<scalar_t, R1, C2>> result(u.size());
      for (std::size_t i = 0; i < u.size(); ++i) {
        LF_ASSERT_MSG(u[i].cols() == v[i].rows(),
                      "#cols of lhs doesn't match #rows of rhs");
        result[i] = u[i] * v[i];
      }
      return result;
    } else {  // NOLINT
      // multiply dynamic sized matrices
      std::vector<Eigen::Matrix<scalar_t, Eigen::Dynamic, Eigen::Dynamic>>
          result;
      result.reserve(u.size());
      for (int i = 0; i < u.size(); ++i) {
        LF_ASSERT_MSG(u[i].cols() == v[i].rows(),
                      "#cols of lhs doesn't match #rows of rhs");
        result.emplace_back(u[i] * v[i]);
      }
      return result;
    }
  }